

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O2

void DoBlending(PalEntry *from,PalEntry *to,int count,int r,int g,int b,int a)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  uint count_00;
  ulong uVar4;
  
  if (a == 0x100) {
    uVar2 = 0;
    uVar4 = (ulong)(uint)count;
    if (count < 1) {
      uVar4 = uVar2;
    }
    for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      to[uVar2].field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)(g << 8 | r << 0x10 | b);
    }
  }
  else if (a == 0) {
    if (from != to) {
      memcpy(to,from,(long)count << 2);
      return;
    }
  }
  else {
    if ((3 < count) && ((CPU.field_6._4_8_ & 0x400000000000000) != 0)) {
      count_00 = count & 0x7ffffffc;
      DoBlending_SSE2(from,to,count_00,r,g,b,a);
      count = count & 3;
      if (count == 0) {
        return;
      }
      from = from + count_00;
      to = to + count_00;
    }
    iVar1 = 0x100 - a;
    lVar3 = 2;
    for (; 0 < count; count = count - 1) {
      *(char *)((long)&to->field_0 + lVar3) =
           (char)((uint)*(byte *)((long)&from->field_0 + lVar3) * iVar1 + r * a >> 8);
      *(char *)((long)to + lVar3 + -1) =
           (char)((uint)*(byte *)((long)from + lVar3 + -1) * iVar1 + g * a >> 8);
      *(char *)((long)to + lVar3 + -2) =
           (char)((uint)*(byte *)((long)from + lVar3 + -2) * iVar1 + b * a >> 8);
      lVar3 = lVar3 + 4;
    }
  }
  return;
}

Assistant:

void DoBlending (const PalEntry *from, PalEntry *to, int count, int r, int g, int b, int a)
{
	if (a == 0)
	{
		if (from != to)
		{
			memcpy (to, from, count * sizeof(DWORD));
		}
		return;
	}
	else if (a == 256)
	{
		DWORD t = MAKERGB(r,g,b);
		int i;

		for (i = 0; i < count; i++)
		{
			to[i] = t;
		}
		return;
	}
#if defined(_M_X64) || defined(_M_IX86) || defined(__i386__) || defined(__amd64__)
	else if (CPU.bSSE2)
	{
		if (count >= 4)
		{
			int not3count = count & ~3;
			DoBlending_SSE2 (from, to, not3count, r, g, b, a);
			count &= 3;
			if (count <= 0)
			{
				return;
			}
			from += not3count;
			to += not3count;
		}
	}
#endif
#if defined(_M_IX86) || defined(__i386__)
	else if (CPU.bMMX)
	{
		if (count >= 4)
		{
			int not3count = count & ~3;
			DoBlending_MMX (from, to, not3count, r, g, b, a);
			count &= 3;
			if (count <= 0)
			{
				return;
			}
			from += not3count;
			to += not3count;
		}
	}
#endif
	int i, ia;

	ia = 256 - a;
	r *= a;
	g *= a;
	b *= a;

	for (i = count; i > 0; i--, to++, from++)
	{
		to->r = (r + from->r * ia) >> 8;
		to->g = (g + from->g * ia) >> 8;
		to->b = (b + from->b * ia) >> 8;
	}
}